

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void set_tile_info(AV1_COMMON *cm,TileConfig *tile_cfg)

{
  SequenceHeader *pSVar1;
  int iVar2;
  int iVar3;
  long in_RSI;
  AV1_COMMON *in_RDI;
  int j_1;
  int size_sb_1;
  int sb_rows;
  int j;
  int size_sb;
  int min_log2_cols;
  int sb_cols;
  int start_sb;
  int i;
  CommonTileParams *tiles;
  SequenceHeader *seq_params;
  CommonModeInfoParams *mi_params;
  int local_70;
  int local_68;
  int local_64;
  int in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint uVar4;
  int local_58;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int iVar5;
  int in_stack_ffffffffffffffd4;
  int iVar6;
  
  pSVar1 = in_RDI->seq_params;
  av1_get_tile_limits((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  iVar2 = (in_RDI->mi_params).mi_cols + (1 << ((byte)pSVar1->mib_size_log2 & 0x1f)) + -1 >>
          ((byte)pSVar1->mib_size_log2 & 0x1f);
  if ((*(int *)(in_RSI + 0x10) == 0) || (*(int *)(in_RSI + 0x14) == 0)) {
    (in_RDI->tiles).uniform_spacing = 1;
    if ((in_RDI->tiles).min_log2_cols < *(int *)(in_RSI + 8)) {
      in_stack_ffffffffffffffb0 = *(int *)(in_RSI + 8);
    }
    else {
      in_stack_ffffffffffffffb0 = (in_RDI->tiles).min_log2_cols;
    }
    (in_RDI->tiles).log2_cols = in_stack_ffffffffffffffb0;
    iVar2 = coded_to_superres_mi(iVar2,(uint)in_RDI->superres_scale_denominator);
    for (in_stack_ffffffffffffffc8 = 0;
        (in_RDI->tiles).max_width_sb << ((byte)in_stack_ffffffffffffffc8 & 0x1f) <= iVar2;
        in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + 1) {
    }
    in_stack_ffffffffffffffac = in_stack_ffffffffffffffc8;
    if (in_stack_ffffffffffffffc8 < (in_RDI->tiles).log2_cols) {
      in_stack_ffffffffffffffac = (in_RDI->tiles).log2_cols;
    }
    (in_RDI->tiles).log2_cols = in_stack_ffffffffffffffac;
    if ((in_RDI->tiles).log2_cols < (in_RDI->tiles).max_log2_cols) {
      local_58 = (in_RDI->tiles).log2_cols;
    }
    else {
      local_58 = (in_RDI->tiles).max_log2_cols;
    }
    (in_RDI->tiles).log2_cols = local_58;
  }
  else if (*(int *)(in_RSI + 0x18) < 0) {
    auto_tile_size_balancing(in_RDI,iVar2,*(int *)(in_RSI + 8),1);
  }
  else {
    (in_RDI->tiles).uniform_spacing = 0;
    in_stack_ffffffffffffffd4 = 0;
    in_stack_ffffffffffffffd0 = 0;
    uVar4 = in_stack_ffffffffffffffa4;
    in_stack_ffffffffffffffc0 = 0;
    while( true ) {
      in_stack_ffffffffffffffa4 = uVar4 & 0xffffff;
      if (in_stack_ffffffffffffffd0 < iVar2) {
        in_stack_ffffffffffffffa4 = CONCAT13(in_stack_ffffffffffffffd4 < 0x40,(int3)uVar4);
      }
      if ((char)(in_stack_ffffffffffffffa4 >> 0x18) == '\0') break;
      (in_RDI->tiles).col_start_sb[in_stack_ffffffffffffffd4] = in_stack_ffffffffffffffd0;
      iVar5 = in_stack_ffffffffffffffc0 + 1;
      in_stack_ffffffffffffffc4 = *(int *)(in_RSI + 0x18 + (long)in_stack_ffffffffffffffc0 * 4);
      if (*(int *)(in_RSI + 0x10) <= iVar5) {
        iVar5 = 0;
      }
      in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffc4;
      if ((in_RDI->tiles).max_width_sb <= in_stack_ffffffffffffffc4) {
        in_stack_ffffffffffffffa0 = (in_RDI->tiles).max_width_sb;
      }
      in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffa0 + in_stack_ffffffffffffffd0;
      in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1;
      uVar4 = in_stack_ffffffffffffffa4;
      in_stack_ffffffffffffffc0 = iVar5;
    }
    (in_RDI->tiles).cols = in_stack_ffffffffffffffd4;
    (in_RDI->tiles).col_start_sb[in_stack_ffffffffffffffd4] = iVar2;
  }
  av1_calculate_tile_cols
            ((SequenceHeader *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),iVar2,
             in_stack_ffffffffffffffc8,
             (CommonTileParams *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  iVar2 = (in_RDI->mi_params).mi_rows + (1 << ((byte)pSVar1->mib_size_log2 & 0x1f)) + -1 >>
          ((byte)pSVar1->mib_size_log2 & 0x1f);
  if ((in_RDI->tiles).uniform_spacing == 0) {
    if (*(int *)(in_RSI + 0x118) < 0) {
      auto_tile_size_balancing(in_RDI,iVar2,*(int *)(in_RSI + 0xc),0);
    }
    else {
      iVar6 = 0;
      in_stack_ffffffffffffffb4 = 0;
      for (iVar5 = 0; iVar5 < iVar2 && iVar6 < 0x40; iVar5 = local_70 + iVar5) {
        (in_RDI->tiles).row_start_sb[iVar6] = iVar5;
        iVar3 = in_stack_ffffffffffffffb4 + 1;
        local_70 = *(int *)(in_RSI + 0x118 + (long)in_stack_ffffffffffffffb4 * 4);
        if (*(int *)(in_RSI + 0x14) <= iVar3) {
          iVar3 = 0;
        }
        if ((in_RDI->tiles).max_height_sb <= local_70) {
          local_70 = (in_RDI->tiles).max_height_sb;
        }
        iVar6 = iVar6 + 1;
        in_stack_ffffffffffffffb4 = iVar3;
      }
      (in_RDI->tiles).rows = iVar6;
      (in_RDI->tiles).row_start_sb[iVar6] = iVar2;
    }
  }
  else {
    if ((in_RDI->tiles).min_log2_rows < *(int *)(in_RSI + 0xc)) {
      local_64 = *(int *)(in_RSI + 0xc);
    }
    else {
      local_64 = (in_RDI->tiles).min_log2_rows;
    }
    (in_RDI->tiles).log2_rows = local_64;
    if ((in_RDI->tiles).log2_rows < (in_RDI->tiles).max_log2_rows) {
      local_68 = (in_RDI->tiles).log2_rows;
    }
    else {
      local_68 = (in_RDI->tiles).max_log2_rows;
    }
    (in_RDI->tiles).log2_rows = local_68;
  }
  av1_calculate_tile_rows
            ((SequenceHeader *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac,
             (CommonTileParams *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  return;
}

Assistant:

static void set_tile_info(AV1_COMMON *const cm,
                          const TileConfig *const tile_cfg) {
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const SequenceHeader *const seq_params = cm->seq_params;
  CommonTileParams *const tiles = &cm->tiles;
  int i, start_sb;

  av1_get_tile_limits(cm);

  int sb_cols =
      CEIL_POWER_OF_TWO(mi_params->mi_cols, seq_params->mib_size_log2);
  // configure tile columns
  if (tile_cfg->tile_width_count == 0 || tile_cfg->tile_height_count == 0) {
    tiles->uniform_spacing = 1;
    tiles->log2_cols = AOMMAX(tile_cfg->tile_columns, tiles->min_log2_cols);
    // Add a special case to handle super resolution
    sb_cols = coded_to_superres_mi(sb_cols, cm->superres_scale_denominator);
    int min_log2_cols = 0;
    for (; (tiles->max_width_sb << min_log2_cols) <= sb_cols; ++min_log2_cols) {
    }
    tiles->log2_cols = AOMMAX(tiles->log2_cols, min_log2_cols);

    tiles->log2_cols = AOMMIN(tiles->log2_cols, tiles->max_log2_cols);
  } else if (tile_cfg->tile_widths[0] < 0) {
    auto_tile_size_balancing(cm, sb_cols, tile_cfg->tile_columns, 1);
  } else {
    int size_sb, j = 0;
    tiles->uniform_spacing = 0;
    for (i = 0, start_sb = 0; start_sb < sb_cols && i < MAX_TILE_COLS; i++) {
      tiles->col_start_sb[i] = start_sb;
      size_sb = tile_cfg->tile_widths[j++];
      if (j >= tile_cfg->tile_width_count) j = 0;
      start_sb += AOMMIN(size_sb, tiles->max_width_sb);
    }
    tiles->cols = i;
    tiles->col_start_sb[i] = sb_cols;
  }
  av1_calculate_tile_cols(seq_params, mi_params->mi_rows, mi_params->mi_cols,
                          tiles);

  // configure tile rows
  int sb_rows =
      CEIL_POWER_OF_TWO(mi_params->mi_rows, seq_params->mib_size_log2);
  if (tiles->uniform_spacing) {
    tiles->log2_rows = AOMMAX(tile_cfg->tile_rows, tiles->min_log2_rows);
    tiles->log2_rows = AOMMIN(tiles->log2_rows, tiles->max_log2_rows);
  } else if (tile_cfg->tile_heights[0] < 0) {
    auto_tile_size_balancing(cm, sb_rows, tile_cfg->tile_rows, 0);
  } else {
    int size_sb, j = 0;
    for (i = 0, start_sb = 0; start_sb < sb_rows && i < MAX_TILE_ROWS; i++) {
      tiles->row_start_sb[i] = start_sb;
      size_sb = tile_cfg->tile_heights[j++];
      if (j >= tile_cfg->tile_height_count) j = 0;
      start_sb += AOMMIN(size_sb, tiles->max_height_sb);
    }
    tiles->rows = i;
    tiles->row_start_sb[i] = sb_rows;
  }
  av1_calculate_tile_rows(seq_params, mi_params->mi_rows, tiles);
}